

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O2

void __thiscall tsip::tsip(tsip *this,string *_port,bool verbose)

{
  bool bVar1;
  string local_30;
  
  (this->gps_port)._M_dataplus._M_p = (pointer)&(this->gps_port).field_2;
  (this->gps_port)._M_string_length = 0;
  (this->gps_port).field_2._M_local_buf[0] = '\0';
  this->verbose = true;
  this->debug = false;
  this->_rad = 57.29577951308232;
  init_rpt(this);
  bVar1 = std::operator!=(_port,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_30,(string *)_port);
    open_gps_port(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

tsip::tsip(std::string _port, bool verbose) {
	// set verbose
	set_verbose(true);
	set_debug(false);

	//conversion factor to compute radians to degrees
	_rad = 180/M_PI;
	//init report fields
	init_rpt();

	if (_port != "") {
		open_gps_port(_port);
	}
	//// set the port
	//set_gps_port(port);

    //file = fopen(gps_port.c_str(), "r");
////        FILE *file = fopen(gps_port.c_str(), "r");

    //if(!file)
    //{
		////if open fails - terminate run
        //printf("Cannot open %s\n", gps_port.c_str());
        //exit;
    //}

    //setup_serial_port(file);
}